

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

MIR_type_t get_op_type(c2m_ctx_t c2m_ctx,op_t op)

{
  MIR_type_t MVar1;
  
  switch(op.mir_op._8_1_) {
  case (BADTYPE)0x1:
    MVar1 = reg_type((c2m_ctx_t)c2m_ctx->ctx,SUB84(c2m_ctx->gen_ctx->curr_func->u,0));
    return MVar1;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x284a,"MIR_type_t get_op_type(c2m_ctx_t, op_t)");
  case (BADTYPE)0x3:
    MVar1 = MIR_T_I64;
    break;
  case (BADTYPE)0x4:
    MVar1 = MIR_T_U64;
    break;
  case (BADTYPE)0x5:
    MVar1 = MIR_T_F;
    break;
  case (BADTYPE)0x6:
    MVar1 = MIR_T_D;
    break;
  case (BADTYPE)0x7:
    MVar1 = MIR_T_LD;
    break;
  case (BADTYPE)0xa:
    MVar1 = (MIR_type_t)(byte)op.mir_op.u.reg._0_1_;
  }
  return MVar1;
}

Assistant:

static MIR_type_t get_op_type (c2m_ctx_t c2m_ctx, op_t op) {
  switch (op.mir_op.mode) {
  case MIR_OP_MEM: return op.mir_op.u.mem.type;
  case MIR_OP_REG: return reg_type (c2m_ctx, op.mir_op.u.reg);
  case MIR_OP_INT: return MIR_T_I64;
  case MIR_OP_UINT: return MIR_T_U64;
  case MIR_OP_FLOAT: return MIR_T_F;
  case MIR_OP_DOUBLE: return MIR_T_D;
  case MIR_OP_LDOUBLE: return MIR_T_LD;
  default: assert (FALSE); return MIR_T_I64;
  }
}